

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision.cpp
# Opt level: O0

int __thiscall CCollision::GetTile(CCollision *this,int x,int y)

{
  int iVar1;
  int iVar2;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  int Ny;
  int Nx;
  uint local_24;
  
  iVar1 = clamp<int>(in_ESI / 0x20,0,(int)in_RDI[1] + -1);
  iVar2 = clamp<int>(in_EDX / 0x20,0,*(int *)((long)in_RDI + 0xc) + -1);
  if (*(byte *)(*in_RDI + (long)(iVar2 * (int)in_RDI[1] + iVar1) * 4) < 0x81) {
    local_24 = (uint)*(byte *)(*in_RDI + (long)(iVar2 * (int)in_RDI[1] + iVar1) * 4);
  }
  else {
    local_24 = 0;
  }
  return local_24;
}

Assistant:

int CCollision::GetTile(int x, int y) const
{
	int Nx = clamp(x/32, 0, m_Width-1);
	int Ny = clamp(y/32, 0, m_Height-1);

	return m_pTiles[Ny*m_Width+Nx].m_Index > 128 ? 0 : m_pTiles[Ny*m_Width+Nx].m_Index;
}